

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_lpf2_init_preallocated(ma_lpf2_config *pConfig,void *pHeap,ma_lpf2 *pLPF)

{
  double dVar1;
  ma_result mVar2;
  ulong uVar3;
  double __x;
  double dVar4;
  ma_biquad_config local_58;
  
  mVar2 = MA_INVALID_ARGS;
  if (pLPF != (ma_lpf2 *)0x0) {
    (pLPF->bq)._pHeap = (void *)0x0;
    *(undefined8 *)&(pLPF->bq)._ownsHeap = 0;
    (pLPF->bq).pR1 = (ma_biquad_coefficient *)0x0;
    (pLPF->bq).pR2 = (ma_biquad_coefficient *)0x0;
    (pLPF->bq).b2 = (ma_biquad_coefficient)0x0;
    (pLPF->bq).a1 = (ma_biquad_coefficient)0x0;
    *(undefined8 *)&(pLPF->bq).a2 = 0;
    (pLPF->bq).format = ma_format_unknown;
    (pLPF->bq).channels = 0;
    (pLPF->bq).b0 = (ma_biquad_coefficient)0x0;
    (pLPF->bq).b1 = (ma_biquad_coefficient)0x0;
    if (pConfig != (ma_lpf2_config *)0x0) {
      dVar1 = pConfig->q;
      __x = (pConfig->cutoffFrequency * 6.283185307179586) / (double)pConfig->sampleRate;
      dVar4 = sin(__x);
      local_58.a1 = sin(1.5707963267948966 - __x);
      dVar4 = dVar4 / (dVar1 + dVar1);
      local_58.b1 = 1.0 - local_58.a1;
      local_58.b0 = local_58.b1 * 0.5;
      local_58.a0 = dVar4 + 1.0;
      local_58.a1 = local_58.a1 * -2.0;
      local_58.a2 = 1.0 - dVar4;
      local_58.format = pConfig->format;
      local_58.channels = pConfig->channels;
      uVar3 = (ulong)local_58.channels;
      (pLPF->bq).format = ma_format_unknown;
      (pLPF->bq).channels = 0;
      (pLPF->bq).b0 = (ma_biquad_coefficient)0x0;
      (pLPF->bq).b1 = (ma_biquad_coefficient)0x0;
      (pLPF->bq).b2 = (ma_biquad_coefficient)0x0;
      (pLPF->bq).a1 = (ma_biquad_coefficient)0x0;
      *(undefined8 *)&(pLPF->bq).a2 = 0;
      (pLPF->bq).pR1 = (ma_biquad_coefficient *)0x0;
      (pLPF->bq).pR2 = (ma_biquad_coefficient *)0x0;
      (pLPF->bq)._pHeap = (void *)0x0;
      *(undefined8 *)&(pLPF->bq)._ownsHeap = 0;
      if (uVar3 != 0) {
        (pLPF->bq)._pHeap = pHeap;
        local_58.b2 = local_58.b0;
        memset(pHeap,0,uVar3 * 8);
        (pLPF->bq).pR1 = (ma_biquad_coefficient *)pHeap;
        (pLPF->bq).pR2 = (ma_biquad_coefficient *)((long)pHeap + uVar3 * 4);
        mVar2 = ma_biquad_reinit(&local_58,&pLPF->bq);
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_lpf2_init_preallocated(const ma_lpf2_config* pConfig, void* pHeap, ma_lpf2* pLPF)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pLPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pLPF);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_lpf2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pLPF->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}